

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cc
# Opt level: O1

void __thiscall tcmalloc::Sampler::Init(Sampler *this,uint64_t seed)

{
  int iVar1;
  ssize_t sVar2;
  
  this->rnd_ = seed;
  iVar1 = 0x14;
  do {
    seed = seed * 0x5deece66d + 0xb & 0xffffffffffff;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  this->rnd_ = seed;
  sVar2 = PickNextSamplingPoint(this);
  this->bytes_until_sample_ = sVar2;
  return;
}

Assistant:

void Sampler::Init(uint64_t seed) {
  DCHECK_NE(seed, 0);

  // Initialize PRNG
  rnd_ = seed;
  // Step it forward 20 times for good measure
  for (int i = 0; i < 20; i++) {
    rnd_ = NextRandom(rnd_);
  }

#ifndef NO_TCMALLOC_SAMPLES
  static TrivialOnce setup_parameter;
  setup_parameter.RunOnce([] () {
    const char* val = GetenvBeforeMain("TCMALLOC_SAMPLE_PARAMETER");
    FLAGS_tcmalloc_sample_parameter = tcmalloc::commandlineflags::StringToLongLong(val, 0);
  });
#endif

  // Initialize counter
  bytes_until_sample_ = PickNextSamplingPoint();
}